

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

int INT_CMCondition_has_signaled(CManager cm,int condition)

{
  CMControlList cl;
  int iVar1;
  CMCondition p_Var2;
  
  cl = cm->control_list;
  set_debug_flag(cm);
  p_Var2 = CMCondition_find(cl,condition);
  if (p_Var2 == (CMCondition)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = p_Var2->signaled;
  }
  return iVar1;
}

Assistant:

extern int
INT_CMCondition_has_signaled(CManager cm, int condition)
{
    int retval;
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);

    cond = CMCondition_find(cl, condition);
    if (!cond) return -1;
    retval = cond->signaled;
    
    return retval;
}